

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O2

bool isValidHttpHeaderNameField(QAnyStringView name)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  QLatin1StringView name_00;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((undefined1  [16])name & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0) {
    lcQHttpHeaders();
    if (((byte)lcQHttpHeaders::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0
       ) {
      pcVar3 = "HTTP header name cannot be empty";
LAB_001852f2:
      local_58[0x14] = '\0';
      local_58[0x15] = '\0';
      local_58[0x16] = '\0';
      local_58[0x17] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      local_58[0x10] = '\0';
      local_58[0x11] = '\0';
      local_58[0x12] = '\0';
      local_58[0x13] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0] = '\x02';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      bVar2 = false;
      local_40 = lcQHttpHeaders::category.name;
      QMessageLogger::warning(local_58,pcVar3);
      goto LAB_001852a4;
    }
  }
  else {
    name_00.m_data = name.field_0.m_data_utf8;
    name_00.m_size = name.m_size & 0x3fffffffffffffff;
    bVar1 = headerNameValidImpl(name_00);
    bVar2 = true;
    if (bVar1) goto LAB_001852a4;
    lcQHttpHeaders();
    if (((byte)lcQHttpHeaders::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0
       ) {
      pcVar3 = "HTTP header name contained illegal character(s)";
      goto LAB_001852f2;
    }
  }
  bVar2 = false;
LAB_001852a4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

static bool isValidHttpHeaderNameField(QAnyStringView name) noexcept
{
    if (name.isEmpty()) {
        qCWarning(lcQHttpHeaders, "HTTP header name cannot be empty");
        return false;
    }
    const bool valid = name.visit([](auto name){ return headerNameValidImpl(name); });
    if (!valid)
        qCWarning(lcQHttpHeaders, "HTTP header name contained illegal character(s)");
    return valid;
}